

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O0

int __thiscall Snes_Spc::dsp_read(Snes_Spc *this,rel_time_t time)

{
  ssize_t sVar1;
  Spc_Dsp *__nbytes;
  uint uVar2;
  void *extraout_RDX;
  int in_ESI;
  Spc_Dsp *in_RDI;
  int result;
  int clock_count;
  int count;
  int in_stack_000000fc;
  Spc_Dsp *in_stack_00000100;
  void *__buf;
  
  uVar2 = (uint)(char)in_RDI[1].m.regs
                      [(int)(*(byte *)((long)in_RDI[1].m.voices[0].buf + 0x12) & 0x7f)];
  __buf = (void *)(ulong)uVar2;
  uVar2 = (in_ESI - uVar2) - in_RDI[1].m.voices[0].buf[0x12];
  __nbytes = in_RDI;
  if (-1 < (int)uVar2) {
    in_RDI[1].m.voices[0].buf[0x12] = (uVar2 & 0xffffffe0) + 0x20 + in_RDI[1].m.voices[0].buf[0x12];
    Spc_Dsp::run(in_stack_00000100,in_stack_000000fc);
    __buf = extraout_RDX;
  }
  sVar1 = Spc_Dsp::read(in_RDI,*(byte *)((long)in_RDI[1].m.voices[0].buf + 0x12) & 0x7f,__buf,
                        (size_t)__nbytes);
  return (int)sVar1;
}

Assistant:

int Snes_Spc::dsp_read( rel_time_t time )
{
	RUN_DSP( time, reg_times [REGS [r_dspaddr] & 0x7F] );
	
	int result = dsp.read( REGS [r_dspaddr] & 0x7F );
	
	#ifdef SPC_DSP_READ_HOOK
		SPC_DSP_READ_HOOK( spc_time + time, (REGS [r_dspaddr] & 0x7F), result );
	#endif
	
	return result;
}